

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::WritePWM(AmpIO *this,uint index,double freq,double duty)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ostream *this_00;
  bool local_39;
  bool ret;
  uint32_t lowTime;
  uint32_t highTime;
  double duty_local;
  double freq_local;
  uint index_local;
  AmpIO *this_local;
  
  if (375.0 < freq) {
    if ((duty < 0.0) || (1.0 < duty)) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
      if (uVar2 == 0x64524131) {
        this_00 = std::operator<<((ostream *)&std::cerr,"AmpIO::WritePWM not implemented for dRAC");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
      else {
        uVar2 = GetDoutCounts(this,duty / freq);
        if (uVar2 < 0x10000) {
          uVar3 = GetDoutCounts(this,(1.0 - duty) / freq);
          if (uVar3 < 0x10000) {
            if ((uVar2 == 0) && (uVar3 == 0)) {
              this_local._7_1_ = false;
            }
            else {
              if (uVar2 == 0) {
                local_39 = WriteDoutControl(this,index,0,0);
                bVar1 = WriteDigitalOutput(this,(uint8_t)(1 << ((byte)index & 0x1f)),'\0');
                local_39 = local_39 && bVar1;
              }
              else if (uVar3 == 0) {
                local_39 = WriteDoutControl(this,index,0,0);
                bVar1 = WriteDigitalOutput(this,(uint8_t)(1 << ((byte)index & 0x1f)),'\x01');
                local_39 = local_39 && bVar1;
              }
              else {
                local_39 = WriteDoutControl(this,index,(uint16_t)uVar2,(uint16_t)uVar3);
              }
              this_local._7_1_ = local_39;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::WritePWM(unsigned int index, double freq, double duty)
{
    // Check for valid frequency (also avoid divide by 0)
    if (freq <= 375.0) return false;
    // Check for valid duty cycle (0-1)
    if ((duty < 0.0) || (duty > 1.0)) return false;

    if (GetHardwareVersion() == dRA1_String) {
        std::cerr << "AmpIO::WritePWM not implemented for dRAC" << std::endl;
        return false;
    }

    // Compute high time and low time (in counts). Note that we return false
    // if either time is greater than 16 bits, rather than attempting to adjust.
    // Starting with Version 1.3.0 of this library, digital outputs are inverted
    // to match the actual output. This function does not need to be changed,
    // however,  because the inversion is performed in WriteDoutControl and
    // WriteDigitalOutput.
    uint32_t highTime = GetDoutCounts(duty/freq);
    if (highTime > 65535L) return false;
    uint32_t lowTime = GetDoutCounts((1.0-duty)/freq);
    if (lowTime > 65535L) return false;
    // Following can occur if frequency is too high
    if ((highTime == 0) && (lowTime == 0)) return false;
    bool ret;
    // If highTime is 0, then turn off PWM at low value
    if (highTime == 0) {
        ret = WriteDoutControl(index, 0, 0);
        ret &= WriteDigitalOutput((1<<index), 0);
    }
    // If lowTime is 0, then turn off PWM at high value
    else if (lowTime == 0) {
        ret = WriteDoutControl(index, 0, 0);
        ret &= WriteDigitalOutput((1<<index), 1);
    }
    else
        ret = WriteDoutControl(index, static_cast<uint16_t>(highTime), static_cast<uint16_t>(lowTime));
    return ret;
}